

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

bool __thiscall FMultiBlockLinesIterator::Next(FMultiBlockLinesIterator *this,CheckResult *item)

{
  uint uVar1;
  undefined2 uVar2;
  FPortalGroupArray *pFVar3;
  double dVar4;
  bool bVar5;
  ushort uVar6;
  short sVar7;
  line_t_conflict *plVar8;
  WORD *pWVar9;
  uint uVar10;
  ushort uVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db_02;
  double in_XMM1_Qa;
  
LAB_00421afe:
  plVar8 = FBlockLinesIterator::Next(&this->blockIterator);
  if (plVar8 != (line_t_conflict *)0x0) {
    item->line = (line_t *)plVar8;
    dVar4 = (this->offset).Y;
    (item->Position).X = (this->offset).X;
    (item->Position).Y = dVar4;
    item->portalflags = (int)this->portalflags;
    goto LAB_00421c3a;
  }
  uVar1 = (int)this->index + 1;
  pFVar3 = this->checklist;
  uVar10 = (uint)pFVar3->varused + (pFVar3->data).Count;
  uVar11 = 0;
  if (uVar1 < uVar10) {
    pWVar9 = pFVar3->entry + uVar1;
    if (3 < uVar1) {
      pWVar9 = (pFVar3->data).Array + ((int)this->index - 3);
    }
    uVar11 = *pWVar9 & 0xc000;
  }
  if (uVar11 == 0x8000 || this->portalflags != 0x20) {
    uVar12 = extraout_XMM0_Da;
    uVar13 = extraout_XMM0_Db;
    if (uVar11 != 0x4000 && this->portalflags == 0x40) {
      bVar5 = GoDown(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),in_XMM1_Qa);
      uVar12 = extraout_XMM0_Da_01;
      uVar13 = extraout_XMM0_Db_01;
      goto LAB_00421b8f;
    }
  }
  else {
    bVar5 = GoUp(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),in_XMM1_Qa);
    uVar12 = extraout_XMM0_Da_00;
    uVar13 = extraout_XMM0_Db_00;
LAB_00421b8f:
    if (bVar5 != false) goto LAB_00421afe;
  }
  if (uVar1 < uVar10) {
    uVar2 = this->index;
    uVar6 = uVar2 + 1;
    this->index = uVar6;
    pWVar9 = this->checklist->entry + (uint)(int)(short)uVar6;
    if (3 < uVar6) {
      pWVar9 = (this->checklist->data).Array + ((int)(short)uVar6 - 4);
    }
    startIteratorForGroup(this,*pWVar9 & 0x3fff);
    sVar7 = (ushort)(uVar11 == 0x4000) << 6;
    if (uVar11 == 0x8000) {
      sVar7 = 0x20;
    }
    this->portalflags = sVar7;
  }
  else {
    this->cursector = this->startsector;
    bVar5 = GoUp(this,(double)CONCAT44(uVar13,uVar12),in_XMM1_Qa);
    if ((!bVar5) &&
       (bVar5 = GoDown(this,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02),in_XMM1_Qa),
       !bVar5)) {
LAB_00421c3a:
      return plVar8 != (line_t_conflict *)0x0;
    }
  }
  goto LAB_00421afe;
}

Assistant:

bool FMultiBlockLinesIterator::Next(FMultiBlockLinesIterator::CheckResult *item)
{
	line_t *line = blockIterator.Next();
	if (line != NULL)
	{
		item->line = line;
		item->Position.X = offset.X;
		item->Position.Y = offset.Y;
		item->portalflags = portalflags;
		return true;
	}
	bool onlast = unsigned(index + 1) >= checklist.Size();
	int nextflags = onlast ? 0 : checklist[index + 1] & FPortalGroupArray::FLAT;

	if (portalflags == FFCF_NOFLOOR && nextflags != FPortalGroupArray::UPPER)
	{
		// if this is the last upper portal in the list, check if we need to go further up to find the real ceiling.
		if (GoUp(offset.X, offset.Y)) return Next(item);
	}
	else if (portalflags == FFCF_NOCEILING && nextflags != FPortalGroupArray::LOWER)
	{
		// if this is the last lower portal in the list, check if we need to go further down to find the real floor.
		if (GoDown(offset.X, offset.Y)) return Next(item);
	}
	if (onlast)
	{
		cursector = startsector;
		// We reached the end of the list. Check if we still need to check up- and downwards.
		if (GoUp(checkpoint.X, checkpoint.Y) ||
			GoDown(checkpoint.X, checkpoint.Y))
		{
			return Next(item);
		}
		return false;
	}

	index++;
	startIteratorForGroup(checklist[index] & ~FPortalGroupArray::FLAT);
	switch (nextflags)
	{
	case FPortalGroupArray::UPPER:
		portalflags = FFCF_NOFLOOR;
		break;

	case FPortalGroupArray::LOWER:
		portalflags = FFCF_NOCEILING;
		break;

	default:
		portalflags = 0;
	}

	return Next(item);
}